

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void av1_loop_restoration_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,AVxWorker *workers,
               int num_workers,AV1LrSync *lr_sync,void *lr_ctxt,int do_extend_border)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  AV1LrMTInfo *pAVar5;
  long lVar6;
  LRWorkerData *pLVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  AVxWorkerInterface *pAVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  RestorationInfo *pRVar18;
  int iVar19;
  AV1LrSync *pAVar20;
  int iVar21;
  uint uVar22;
  AVxWorker *pAVar23;
  AVxWorker *pAVar24;
  int *piVar25;
  bool bVar26;
  FilterFrameCtxt *ctxt;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  pAVar20 = lr_sync;
  av1_loop_restoration_filter_frame_init
            ((AV1LrStruct *)lr_ctxt,frame,cm,optimized_lr,
             (uint)(cm->seq_params->monochrome == '\0') * 2 + 1);
  uVar22 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  pAVar12 = aom_get_worker_interface();
  piVar25 = &cm->rst_info[0].restoration_unit_size;
  lVar16 = 0;
  iVar9 = 0;
  do {
    if (((RestorationInfo *)(piVar25 + -1))->frame_restoration_type != RESTORE_NONE) {
      iVar11 = *(int *)((long)lr_ctxt + lVar16 + 0x1c);
      iVar2 = *piVar25;
      iVar8 = av1_lr_count_units(iVar2,iVar11);
      if (iVar9 <= iVar8) {
        iVar9 = av1_lr_count_units(iVar2,iVar11);
      }
    }
    iVar11 = (int)pAVar20;
    lVar16 = lVar16 + 0x38;
    piVar25 = piVar25 + 0x10;
  } while ((ulong)uVar22 * 0x38 - lVar16 != 0);
  if ((((lr_sync->sync_range == 0) || (lr_sync->rows < iVar9)) ||
      (lr_sync->num_workers < num_workers)) || (lr_sync->num_planes < (int)uVar22)) {
    av1_loop_restoration_dealloc(lr_sync);
    av1_loop_restoration_alloc(lr_sync,cm,num_workers,iVar9,uVar22,iVar11);
  }
  lr_sync->lr_mt_exit = false;
  uVar14 = 0;
  do {
    memset(lr_sync->cur_sb_col[uVar14],0xff,(long)iVar9 << 2);
    uVar14 = uVar14 + 1;
  } while (uVar22 != uVar14);
  pSVar4 = cm->seq_params;
  uVar1 = pSVar4->monochrome;
  pAVar5 = lr_sync->job_queue;
  lr_sync->jobs_enqueued = 0;
  lr_sync->jobs_dequeued = 0;
  lVar16 = (ulong)(uVar1 == '\0') * 2 + 1;
  lVar13 = 0;
  local_1d0.has_detail = 0;
  pRVar18 = cm->rst_info;
  do {
    if (pRVar18->frame_restoration_type != RESTORE_NONE) {
      local_1d0.has_detail =
           local_1d0.has_detail + (*(int *)(*(long *)((long)lr_ctxt + lVar13 + 8) + 0xc) + 1 >> 1);
    }
    lVar13 = lVar13 + 0x38;
    pRVar18 = pRVar18 + 1;
  } while (lVar16 * 0x38 - lVar13 != 0);
  local_1d0.error_code = AOM_CODEC_OK;
  iVar9 = 0;
  lVar13 = 0;
  do {
    if (cm->rst_info[lVar13].frame_restoration_type != RESTORE_NONE) {
      bVar26 = false;
      if (lVar13 != 0) {
        bVar26 = pSVar4->subsampling_y != 0;
      }
      iVar11 = *(int *)((long)lr_ctxt + lVar13 * 0x38 + 0x1c);
      if (0 < iVar11) {
        lVar6 = *(long *)((long)lr_ctxt + lVar13 * 0x38 + 8);
        iVar2 = *(int *)(lVar6 + 4);
        uVar22 = 0;
        iVar8 = 0;
        do {
          iVar17 = iVar11 - iVar8;
          if ((iVar2 * 3) / 2 <= iVar11 - iVar8) {
            iVar17 = iVar2;
          }
          iVar17 = iVar17 + iVar8;
          iVar8 = iVar8 - (8U >> bVar26);
          iVar19 = 0;
          if (0 < iVar8) {
            iVar19 = iVar8;
          }
          uVar10 = 8U >> bVar26;
          if (iVar11 <= iVar17) {
            uVar10 = 0;
          }
          iVar21 = iVar17 - uVar10;
          uVar10 = uVar22 & 1;
          iVar3 = *(int *)(local_1d0.detail + (ulong)uVar10 * 4 + -8);
          pAVar5[iVar3].lr_unit_row = uVar22;
          pAVar5[iVar3].plane = (int)lVar13;
          pAVar5[iVar3].v_start = iVar19;
          pAVar5[iVar3].v_end = iVar21;
          pAVar5[iVar3].sync_mode = uVar10;
          if ((uVar22 & 1) == 0) {
            pAVar5[iVar3].v_copy_start = iVar19 + 3;
            pAVar5[iVar3].v_copy_end = iVar21 + -3;
            if (uVar22 == 0) {
              pAVar5[iVar3].v_copy_start = 0;
            }
            if (uVar22 == *(int *)(lVar6 + 0xc) - 1U) {
              pAVar5[iVar3].v_copy_end = iVar11;
            }
          }
          else {
            if (iVar8 < 4) {
              iVar8 = 3;
            }
            pAVar5[iVar3].v_copy_start = iVar8 + -3;
            iVar8 = iVar21 + 3;
            if (iVar11 <= iVar21 + 3) {
              iVar8 = iVar11;
            }
            pAVar5[iVar3].v_copy_end = iVar8;
          }
          uVar22 = uVar22 + 1;
          *(int *)(local_1d0.detail + (ulong)uVar10 * 4 + -8) = iVar3 + 1;
          iVar8 = iVar17;
        } while (iVar17 < iVar11);
        iVar9 = iVar9 + uVar22;
        lr_sync->jobs_enqueued = iVar9;
      }
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != lVar16);
  uVar14 = (ulong)(uint)num_workers;
  if (0 < num_workers) {
    lVar16 = uVar14 - 1;
    pAVar23 = workers + lVar16;
    pLVar7 = lr_sync->lrworkerdata;
    pLVar7[lVar16].lr_ctxt = lr_ctxt;
    pLVar7[lVar16].do_extend_border = do_extend_border;
    workers[lVar16].hook = loop_restoration_row_worker;
    workers[lVar16].data1 = lr_sync;
    workers[lVar16].data2 = pLVar7 + lVar16;
    workers[lVar16].had_error = 0;
    pAVar24 = pAVar23;
    if (lVar16 != 0) {
      lVar13 = uVar14 * 0x1c0 + -0x380;
      do {
        (*pAVar12->launch)(pAVar23);
        pLVar7 = lr_sync->lrworkerdata;
        *(void **)((pLVar7->error_info).detail + lVar13 + -0x18) = lr_ctxt;
        *(int *)((pLVar7->error_info).detail + lVar13 + -0x10) = do_extend_border;
        pAVar23[-1].hook = loop_restoration_row_worker;
        pAVar23[-1].data1 = lr_sync;
        pAVar23[-1].data2 = (pLVar7->error_info).detail + lVar13 + -0x28;
        pAVar23[-1].had_error = 0;
        pAVar23 = pAVar23 + -1;
        lVar13 = lVar13 + -0x1c0;
        lVar16 = lVar16 + -1;
        pAVar24 = workers;
      } while (lVar16 != 0);
    }
    (*pAVar12->execute)(pAVar24);
  }
  pAVar12 = aom_get_worker_interface();
  iVar9 = workers->had_error;
  if (iVar9 != 0) {
    memcpy(&local_1d0,(void *)((long)workers->data2 + 0x20),0x1a0);
  }
  if (1 < num_workers) {
    uVar15 = uVar14 + 1;
    pAVar23 = workers + uVar14;
    do {
      iVar11 = (*pAVar12->sync)(pAVar23 + -1);
      if (iVar11 == 0) {
        memcpy(&local_1d0,(void *)((long)pAVar23[-1].data2 + 0x20),0x1a0);
        iVar9 = 1;
      }
      uVar15 = uVar15 - 1;
      pAVar23 = pAVar23 + -1;
    } while (2 < uVar15);
  }
  if (iVar9 != 0) {
    aom_internal_error_copy(cm->error,&local_1d0);
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_mt(YV12_BUFFER_CONFIG *frame,
                                          AV1_COMMON *cm, int optimized_lr,
                                          AVxWorker *workers, int num_workers,
                                          AV1LrSync *lr_sync, void *lr_ctxt,
                                          int do_extend_border) {
  assert(!cm->features.all_lossless);

  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes_mt(loop_rest_ctxt, workers, num_workers, lr_sync,
                                 cm, do_extend_border);
}